

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcBuilding::IfcBuilding(IfcBuilding *this)

{
  IfcBuilding *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x198,"IfcBuilding");
  IfcSpatialStructureElement::IfcSpatialStructureElement
            (&this->super_IfcSpatialStructureElement,&PTR_construction_vtable_24__00e4cc08);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuilding,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcBuilding,_3UL> *)
             &(this->super_IfcSpatialStructureElement).field_0x158,
             &PTR_construction_vtable_24__00e4ccf8);
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject =
       0xe4cb00;
  *(undefined8 *)&this->field_0x198 = 0xe4cbf0;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0x88 = 0xe4cb28;
  (this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xe4cb50;
  *(undefined8 *)
   &(this->super_IfcSpatialStructureElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0xe4cb78;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).super_IfcProduct.field_0x100 = 0xe4cba0;
  *(undefined8 *)&(this->super_IfcSpatialStructureElement).field_0x158 = 0xe4cbc8;
  STEP::Maybe<double>::Maybe((Maybe<double> *)&(this->super_IfcSpatialStructureElement).field_0x168)
  ;
  STEP::Maybe<double>::Maybe(&this->ElevationOfTerrain);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>::Maybe
            (&this->BuildingAddress);
  return;
}

Assistant:

IfcBuilding() : Object("IfcBuilding") {}